

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path_finding_on_map.hpp
# Opt level: O0

vector<graph_tests::PointOnMap,_std::allocator<graph_tests::PointOnMap>_> * __thiscall
graph_tests::PathFindingOnMap::GetNeighbors
          (vector<graph_tests::PointOnMap,_std::allocator<graph_tests::PointOnMap>_>
           *__return_storage_ptr__,PathFindingOnMap *this,PointOnMap *u)

{
  bool bVar1;
  const_iterator poVar2;
  PointOnMap *__args;
  optional<graph_tests::PointOnMap> *neigbor;
  const_iterator __end2;
  const_iterator __begin2;
  optional<graph_tests::PointOnMap> local_c0;
  optional<graph_tests::PointOnMap> local_a0;
  optional<graph_tests::PointOnMap> local_80;
  optional<graph_tests::PointOnMap> local_60;
  initializer_list<std::optional<graph_tests::PointOnMap>_> local_40;
  initializer_list<std::optional<graph_tests::PointOnMap>_> *local_30;
  initializer_list<std::optional<graph_tests::PointOnMap>_> *__range2;
  PointOnMap *local_20;
  PointOnMap *u_local;
  PathFindingOnMap *this_local;
  vector<graph_tests::PointOnMap,_std::allocator<graph_tests::PointOnMap>_> *res;
  
  __range2._7_1_ = 0;
  local_20 = u;
  u_local = (PointOnMap *)this;
  this_local = (PathFindingOnMap *)__return_storage_ptr__;
  std::vector<graph_tests::PointOnMap,_std::allocator<graph_tests::PointOnMap>_>::vector
            (__return_storage_ptr__);
  GetLeft(&local_c0,this,local_20);
  GetUp(&local_a0,this,local_20);
  GetRight(&local_80,this,local_20);
  GetDown(&local_60,this,local_20);
  local_40._M_array = &local_c0;
  local_40._M_len = 4;
  local_30 = &local_40;
  __end2 = std::initializer_list<std::optional<graph_tests::PointOnMap>_>::begin(local_30);
  poVar2 = std::initializer_list<std::optional<graph_tests::PointOnMap>_>::end(local_30);
  for (; __end2 != poVar2; __end2 = __end2 + 1) {
    bVar1 = std::optional::operator_cast_to_bool((optional *)__end2);
    if (bVar1) {
      __args = std::optional<graph_tests::PointOnMap>::operator*(__end2);
      std::vector<graph_tests::PointOnMap,std::allocator<graph_tests::PointOnMap>>::
      emplace_back<graph_tests::PointOnMap_const>
                ((vector<graph_tests::PointOnMap,std::allocator<graph_tests::PointOnMap>> *)
                 __return_storage_ptr__,__args);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<PointOnMap> GetNeighbors(const PointOnMap& u) const {
    std::vector<PointOnMap> res;
    for (auto&& neigbor : { GetLeft(u), GetUp(u), GetRight(u), GetDown(u) }) {
      if (neigbor)
        res.emplace_back(std::move(*neigbor));
    }
    return res;
  }